

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O3

void __thiscall SNexFile::finalizeFile(SNexFile *this)

{
  undefined4 uVar2;
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (this->f != (FILE *)0x0) {
    if ((this->minFileVersion == 3) && (this->reqFileVersion == 2)) {
      Error("[SAVENEX] V1.3?!",(char *)0x0,FATAL);
    }
    updateIfAheadFirstBankSave(this);
    if (this->minFileVersion == 2) {
      (this->h).banksOffset = 0;
      (this->h).bigL2barPosY = '\0';
    }
    else {
      (this->h).magicAndVersion[7] = '3';
      calculateCrc32C(this);
    }
    writeHeader(this);
    fclose((FILE *)this->f);
    this->f = (FILE *)0x0;
    this->canAppend = false;
    if (this->copper != (byte *)0x0) {
      operator_delete__(this->copper);
    }
    this->copper = (byte *)0x0;
    if (this->palette != (byte *)0x0) {
      operator_delete__(this->palette);
    }
    this->palette = (byte *)0x0;
    if ((this->h).ramReq == '\0') {
      auVar4 = *(undefined1 (*) [16])((this->h).banks + 0x60) |
               *(undefined1 (*) [16])((this->h).banks + 0x50) |
               *(undefined1 (*) [16])((this->h).banks + 0x40) |
               *(undefined1 (*) [16])((this->h).banks + 0x30);
      auVar1._0_8_ = auVar4._8_8_;
      auVar1._8_4_ = auVar4._8_4_;
      auVar1._12_4_ = auVar4._12_4_;
      uVar2 = SUB164(auVar1 | auVar4,4);
      auVar3._4_4_ = uVar2;
      auVar3._0_4_ = uVar2;
      auVar3._8_4_ = uVar2;
      auVar3._12_4_ = uVar2;
      auVar3 = auVar3 | auVar1 | auVar4;
      auVar4._0_4_ = auVar3._0_4_ >> 0x10;
      auVar4._4_4_ = 0;
      auVar4._8_4_ = auVar3._8_4_ >> 0x10;
      auVar4._12_4_ = auVar3._12_4_ >> 0x10;
      if (SUB161(auVar4 | auVar3,1) != '\0' || SUB161(auVar4 | auVar3,0) != '\0') {
        Error("[SAVENEX] 2MB bank (48..111) stored without 2MbRamReq set in CFG",(char *)0x0,PASS3);
        return;
      }
    }
  }
  return;
}

Assistant:

void SNexFile::finalizeFile() {
	if (nullptr == f) return;
	// do the final V1.2 / V1.3 updates to the header fields
	// V1.3 auto-detected when V1.2 is required should never happen (Error should be unreachable)
	if (3 == minFileVersion && 2 == reqFileVersion) Error("[SAVENEX] V1.3?!", NULL, FATAL);
	updateIfAheadFirstBankSave();	// if no BANK/AUTO/CLOSE was used -> update all now
	if (2 == minFileVersion) {
		h.banksOffset = 0;		// clear banksOffset for V1.2 files
		h.bigL2barPosY = 0;		// clear big Layer 2 loading-bar posY for V1.2 files
	} else {
		h.magicAndVersion[7] = '3';				// modify file version to "V1.3" string
		calculateCrc32C();
	}
	// refresh the file header to final state
	writeHeader();
	// close the file
	fclose(f);
	f = nullptr;
	canAppend = false;
	if (nullptr != copper) delete[] copper;
	copper = nullptr;
	if (nullptr != palette) delete[] palette;
	palette = nullptr;
	// check if there were banks 48+, but 2MB required was not set
	byte hasExtendedBank = 0;
	for (int i = 48; i < SNexHeader::MAX_BANK; ++i) hasExtendedBank |= h.banks[i];
	if (!h.ramReq && hasExtendedBank) {
		Error("[SAVENEX] 2MB bank (48..111) stored without 2MbRamReq set in CFG");
	}
	return;
}